

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

string * __thiscall
duckdb::Node::VerifyAndToString_abi_cxx11_
          (string *__return_storage_ptr__,Node *this,ART *art,bool only_verify)

{
  ulong uVar1;
  undefined4 uVar2;
  NType type;
  bool bVar3;
  idx_t __val;
  unsafe_optional_ptr<Node> this_00;
  NType NVar4;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool in_R8B;
  uint8_t byte;
  string str;
  byte local_139;
  ART *local_138;
  uint local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  Node *local_e8;
  undefined4 local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (this->super_IndexPointer).data;
  NVar4 = (NType)(uVar1 >> 0x38);
  type = NVar4 & 0x7f;
  local_12c = (uint)only_verify;
  local_138 = art;
  if (type == PREFIX) {
    Prefix::VerifyAndToString_abi_cxx11_
              (&local_108,(Prefix *)art,(ART *)this,(Node *)(ulong)local_12c,in_R8B);
    if ((long)(this->super_IndexPointer).data < 0) {
      ::std::operator+(&local_d8,"Gate [ ",&local_108);
      ::std::operator+(&local_128,&local_d8," ]");
      ::std::__cxx11::string::operator=((string *)&local_108,(string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_d8);
    }
    if (only_verify) {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_128
                );
    }
    else {
      ::std::operator+(__return_storage_ptr__,anon_var_dwarf_4b0ff16 + 8,&local_108);
    }
  }
  else {
    NVar4 = NVar4 & 0x7f;
    if (NVar4 == LEAF) {
      Leaf::DeprecatedVerifyAndToString_abi_cxx11_
                (__return_storage_ptr__,(Leaf *)art,(ART *)this,(Node *)(ulong)local_12c,in_R8B);
      return __return_storage_ptr__;
    }
    if (NVar4 == LEAF_INLINED) {
      if (only_verify) {
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,
                   (allocator *)&local_108);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::to_string(&local_128,uVar1 & 0xffffffffffffff);
      ::std::operator+(&local_108,"Inlined Leaf [row ID: ",&local_128);
      ::std::operator+(__return_storage_ptr__,&local_108,"]");
      ::std::__cxx11::string::~string((string *)&local_108);
      this_01 = &local_128;
      goto LAB_01a197a5;
    }
    __val = GetCapacity(type);
    ::std::__cxx11::to_string(&local_d8,__val);
    ::std::operator+(&local_128,"Node",&local_d8);
    ::std::operator+(&local_108,&local_128,": [ ");
    ::std::__cxx11::string::~string((string *)&local_128);
    ::std::__cxx11::string::~string((string *)&local_d8);
    local_139 = 0;
    local_dc = (undefined4)CONCAT71(in_register_00000009,only_verify);
    local_e8 = this;
    local_b8 = __return_storage_ptr__;
    if ((byte)((*(byte *)((long)&(this->super_IndexPointer).data + 7) & 0x7f) - 8) < 3) {
      ::std::operator+(&local_128,"Leaf ",&local_108);
      ::std::__cxx11::string::operator=((string *)&local_108,(string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
      bVar3 = GetNextByte(this,local_138,&local_139);
      while (bVar3 != false) {
        ::std::__cxx11::to_string(&local_d8,(uint)local_139);
        ::std::operator+(&local_128,&local_d8,"-");
        ::std::__cxx11::string::append((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::__cxx11::string::~string((string *)&local_d8);
        if (local_139 == 0xff) break;
        local_139 = local_139 + 1;
        bVar3 = GetNextByte(local_e8,local_138,&local_139);
      }
    }
    else {
      this_00 = GetNextChildInternal<duckdb::Node_const>(local_138,this,&local_139);
      while (this_00.ptr != (Node *)0x0) {
        ::std::__cxx11::to_string(&local_70,(uint)local_139);
        ::std::operator+(&local_50,"(",&local_70);
        ::std::operator+(&local_b0,&local_50,", ");
        VerifyAndToString_abi_cxx11_(&local_90,this_00.ptr,local_138,SUB41(local_12c,0));
        ::std::operator+(&local_d8,&local_b0,&local_90);
        ::std::operator+(&local_128,&local_d8,")");
        ::std::__cxx11::string::append((string *)&local_108);
        ::std::__cxx11::string::~string((string *)&local_128);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        if (local_139 == 0xff) break;
        local_139 = local_139 + 1;
        this_00 = GetNextChildInternal<duckdb::Node_const>(local_138,local_e8,&local_139);
      }
    }
    __return_storage_ptr__ = local_b8;
    uVar2 = local_dc;
    if ((long)(local_e8->super_IndexPointer).data < 0) {
      ::std::operator+(&local_d8,"Gate [ ",&local_108);
      ::std::operator+(&local_128,&local_d8," ]");
      ::std::__cxx11::string::operator=((string *)&local_108,(string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
      ::std::__cxx11::string::~string((string *)&local_d8);
    }
    if ((char)uVar2 == '\0') {
      ::std::operator+(&local_128,anon_var_dwarf_4b0ff16 + 8,&local_108);
      ::std::operator+(__return_storage_ptr__,&local_128,"]");
      ::std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_128
                );
    }
  }
  this_01 = &local_108;
LAB_01a197a5:
  ::std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

string Node::VerifyAndToString(ART &art, const bool only_verify) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::LEAF_INLINED:
		return only_verify ? "" : "Inlined Leaf [row ID: " + to_string(GetRowId()) + "]";
	case NType::LEAF:
		return Leaf::DeprecatedVerifyAndToString(art, *this, only_verify);
	case NType::PREFIX: {
		auto str = Prefix::VerifyAndToString(art, *this, only_verify);
		if (GetGateStatus() == GateStatus::GATE_SET) {
			str = "Gate [ " + str + " ]";
		}
		return only_verify ? "" : "\n" + str;
	}
	default:
		break;
	}

	string str = "Node" + to_string(GetCapacity(type)) + ": [ ";
	uint8_t byte = 0;

	if (IsLeafNode()) {
		str = "Leaf " + str;
		auto has_byte = GetNextByte(art, byte);
		while (has_byte) {
			str += to_string(byte) + "-";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			has_byte = GetNextByte(art, byte);
		}
	} else {
		auto child = GetNextChild(art, byte);
		while (child) {
			str += "(" + to_string(byte) + ", " + child->VerifyAndToString(art, only_verify) + ")";
			if (byte == NumericLimits<uint8_t>::Maximum()) {
				break;
			}
			byte++;
			child = GetNextChild(art, byte);
		}
	}

	if (GetGateStatus() == GateStatus::GATE_SET) {
		str = "Gate [ " + str + " ]";
	}
	return only_verify ? "" : "\n" + str + "]";
}